

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

void Cmd_setslot(FCommandLine *argv,APlayerPawn *who,int key)

{
  FWeaponSlot *pFVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *in_RAX;
  char *pcVar5;
  long lVar6;
  PClass *pPVar7;
  PClassWeapon *type;
  int i;
  FString config;
  
  config.Chars = in_RAX;
  iVar2 = FCommandLine::argc(argv);
  if (1 < iVar2) {
    pcVar5 = FCommandLine::operator[](argv,1);
    uVar3 = atoi(pcVar5);
    if ((int)uVar3 < 10) {
      if (ParsingKeyConf == true) {
        FString::FString(&config,argv->cmd);
        TArray<FString,_FString>::Push(&KeyConfWeapons,&config);
        FString::~FString(&config);
        return;
      }
      if (PlayingKeyConf != (FWeaponSlots *)0x0) {
        TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::Clear
                  (&PlayingKeyConf->Slots[(int)uVar3].Weapons);
        for (iVar2 = 2; iVar4 = FCommandLine::argc(argv), iVar2 < iVar4; iVar2 = iVar2 + 1) {
          pFVar1 = PlayingKeyConf->Slots;
          pcVar5 = FCommandLine::operator[](argv,iVar2);
          FWeaponSlot::AddWeapon(pFVar1 + (int)uVar3,pcVar5);
        }
        return;
      }
      iVar2 = FCommandLine::argc(argv);
      if (iVar2 == 2) {
        Printf("Slot %d cleared\n",(ulong)uVar3);
      }
      Net_WriteByte('9');
      Net_WriteByte((BYTE)uVar3);
      iVar2 = FCommandLine::argc(argv);
      Net_WriteByte((char)iVar2 + 0xfe);
      for (iVar2 = 2; iVar4 = FCommandLine::argc(argv), iVar2 < iVar4; iVar2 = iVar2 + 1) {
        pcVar5 = FCommandLine::operator[](argv,iVar2);
        pPVar7 = PClass::FindClass(pcVar5);
        type = dyn_cast<PClassWeapon>((DObject *)pPVar7);
        Net_WriteWeapon(type);
      }
      return;
    }
  }
  Printf("Usage: setslot [slot] [weapons]\nCurrent slot assignments:\n");
  lVar6 = (long)consoleplayer;
  if ((&players)[lVar6 * 0x54] != 0) {
    FGameConfigFile::GetConfigPath((FGameConfigFile *)&config,SUB81(GameConfig,0));
    Printf("\x1cHAdd the following to \x1cI%s\x1cH to retain these bindings:\n\x1c-[",config.Chars);
    if (*(int *)(WeaponSection.Chars + -0xc) != 0) {
      Printf("%s.");
    }
    pPVar7 = DObject::GetClass((DObject *)(&players)[(long)consoleplayer * 0x54]);
    Printf("%s.Weapons]\n",
           FName::NameData.NameArray
           [(pPVar7->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].Text);
    FString::~FString(&config);
    lVar6 = (long)consoleplayer;
  }
  FWeaponSlots::PrintSettings((FWeaponSlots *)(lVar6 * 0x2a0 + 0x17dc160));
  return;
}

Assistant:

CCMD (setslot)
{
	int slot;

	if (argv.argc() < 2 || (slot = atoi (argv[1])) >= NUM_WEAPON_SLOTS)
	{
		Printf("Usage: setslot [slot] [weapons]\nCurrent slot assignments:\n");
		if (players[consoleplayer].mo != NULL)
		{
			FString config(GameConfig->GetConfigPath(false));
			Printf(TEXTCOLOR_BLUE "Add the following to " TEXTCOLOR_ORANGE "%s" TEXTCOLOR_BLUE
				" to retain these bindings:\n" TEXTCOLOR_NORMAL "[", config.GetChars());
			if (WeaponSection.IsNotEmpty())
			{
				Printf("%s.", WeaponSection.GetChars());
			}
			Printf("%s.Weapons]\n", players[consoleplayer].mo->GetClass()->TypeName.GetChars());
		}
		players[consoleplayer].weapons.PrintSettings();
		return;
	}

	if (ParsingKeyConf)
	{
		KeyConfWeapons.Push(argv.args());
	}
	else if (PlayingKeyConf != NULL)
	{
		PlayingKeyConf->Slots[slot].Clear();
		for (int i = 2; i < argv.argc(); ++i)
		{
			PlayingKeyConf->Slots[slot].AddWeapon(argv[i]);
		}
	}
	else
	{
		if (argv.argc() == 2)
		{
			Printf ("Slot %d cleared\n", slot);
		}

		Net_WriteByte(DEM_SETSLOT);
		Net_WriteByte(slot);
		Net_WriteByte(argv.argc()-2);
		for (int i = 2; i < argv.argc(); i++)
		{
			Net_WriteWeapon(dyn_cast<PClassWeapon>(PClass::FindClass(argv[i])));
		}
	}
}